

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt strscan_oct(uint8_t *p,TValue *o,StrScanFmt fmt,int32_t neg,uint32_t dig)

{
  uint64_t local_40;
  uint local_38;
  uint64_t x;
  uint32_t dig_local;
  int32_t neg_local;
  StrScanFmt fmt_local;
  TValue *o_local;
  uint8_t *p_local;
  
  x = 0;
  if ((0x16 < dig) || ((dig_local = dig, p_local = p, dig == 0x16 && (0x31 < *p)))) {
    return STRSCAN_ERROR;
  }
  while (dig_local != 0) {
    if ((*p_local < 0x30) || (0x37 < *p_local)) {
      return STRSCAN_ERROR;
    }
    x = x * 8 + (long)(int)(*p_local & 7);
    dig_local = dig_local - 1;
    p_local = p_local + 1;
  }
  fmt_local = fmt;
  if (fmt == STRSCAN_INT) {
    if (neg + 0x80000000 <= x) {
      fmt_local = STRSCAN_U32;
    }
  }
  else if (fmt != STRSCAN_U32) {
    if (neg == 0) {
      local_40 = x;
    }
    else {
      local_40 = (x ^ 0xffffffffffffffff) + 1;
    }
    o->u64 = local_40;
    return fmt;
  }
  if (x >> 0x20 == 0) {
    local_38 = (uint)x;
    if (neg != 0) {
      local_38 = (local_38 ^ 0xffffffff) + 1;
    }
    (o->u32).lo = local_38;
    return fmt_local;
  }
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_oct(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;

  /* Scan octal digits. */
  if (dig > 22 || (dig == 22 && *p > '1')) return STRSCAN_ERROR;
  while (dig-- > 0) {
    if (!(*p >= '0' && *p <= '7')) return STRSCAN_ERROR;
    x = (x << 3) + (*p++ & 7);
  }

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (x >= 0x80000000u+neg) fmt = STRSCAN_U32;
    /* fallthrough */
  case STRSCAN_U32:
    if ((x >> 32)) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~(uint32_t)x+1u) : (int32_t)x;
    break;
  default:
  case STRSCAN_I64:
  case STRSCAN_U64:
    o->u64 = neg ? ~x+1u : x;
    break;
  }
  return fmt;
}